

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::inject(_Mem *this,View *view)

{
  Code *object;
  int iVar1;
  Group *host;
  ulong uVar2;
  uint64_t ijt;
  EInjectionJob *this_00;
  _Mem *this_01;
  
  iVar1 = (*((view->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar1 == '\0') {
    host = View::get_host(view);
    iVar1 = (*(host->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])(host);
    if ((char)iVar1 == '\0') {
      uVar2 = (*Now)();
      this_01 = (_Mem *)view;
      ijt = r_code::View::get_ijt(&view->super_View);
      object = (Code *)(view->super_View).object.object;
      if (object->storage_index < 0) {
        if (ijt <= uVar2) {
          inject_new_object(this,view);
          return;
        }
        this_00 = (EInjectionJob *)operator_new(0x28);
        InjectionJob::InjectionJob((InjectionJob *)this_00,view,ijt);
      }
      else {
        if (ijt <= uVar2) {
          inject_existing_object(this_01,view,object,host);
          return;
        }
        this_00 = (EInjectionJob *)operator_new(0x28);
        EInjectionJob::EInjectionJob(this_00,view,ijt);
      }
      pushTimeJob(this,&this_00->super_TimeJob);
      return;
    }
  }
  (*(view->super_View).super__Object._vptr__Object[1])(view);
  return;
}

Assistant:

void _Mem::inject(View *view)
{
    if (view->object->is_invalidated()) {
        delete view;
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        delete view;
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (view->object->is_registered()) { // existing object.
        if (ijt <= now) {
            inject_existing_object(view, view->object, host);
        } else {
            pushTimeJob(new EInjectionJob(view, ijt));
        }
    } else { // new object.
        if (ijt <= now) {
            inject_new_object(view);
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}